

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O2

ze_result_t
tracing_layer::zeCommandListAppendMemoryPrefetch
          (ze_command_list_handle_t hCommandList,void *ptr,size_t size)

{
  ulong uVar1;
  _func__ze_result_t__ze_command_list_handle_t_ptr_void_ptr_unsigned_long *zeApiPtr;
  _ze_result_t _Var2;
  ze_result_t zVar3;
  char *pcVar4;
  undefined1 *puVar5;
  ulong *puVar6;
  _func_void__ze_command_list_append_memory_prefetch_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *p_Var7;
  long lVar8;
  size_t i;
  ulong uVar9;
  size_t size_local;
  void *ptr_local;
  ze_command_list_handle_t hCommandList_local;
  APITracerCallbackDataImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_78;
  _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_60;
  ze_command_list_append_memory_prefetch_params_t tracerParams;
  
  if (DAT_001893e8 == (_func__ze_result_t__ze_command_list_handle_t_ptr_void_ptr_unsigned_long *)0x0
     ) {
    zVar3 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    size_local = size;
    ptr_local = ptr;
    hCommandList_local = hCommandList;
    pcVar4 = (char *)tracingInProgress();
    if (*pcVar4 != '\0') {
      _Var2 = (*DAT_001893e8)(hCommandList,ptr,size);
      return _Var2;
    }
    puVar5 = (undefined1 *)tracingInProgress();
    *puVar5 = 1;
    tracerParams.phCommandList = &hCommandList_local;
    tracerParams.pptr = &ptr_local;
    tracerParams.psize = &size_local;
    apiCallbackData.epilogCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    apiCallbackData.epilogCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    apiCallbackData.prologCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    apiCallbackData.prologCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    apiCallbackData.epilogCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    apiCallbackData.apiOrdinal =
         (_func_void__ze_command_list_append_memory_prefetch_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
          *)0x0;
    apiCallbackData.prologCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    puVar6 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
    if (puVar6 == (ulong *)0x0) {
      p_Var7 = (_func_void__ze_command_list_append_memory_prefetch_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                *)0x0;
    }
    else {
      lVar8 = 0xcb0;
      for (uVar9 = 0; p_Var7 = apiCallbackData.apiOrdinal, uVar9 < *puVar6; uVar9 = uVar9 + 1) {
        uVar1 = puVar6[1];
        prologCallback.current_api_callback =
             *(_func_void__ze_command_list_append_memory_prefetch_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
               **)((uVar1 - 0xa20) + lVar8);
        p_Var7 = *(_func_void__ze_command_list_append_memory_prefetch_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                   **)((uVar1 - 0x3c8) + lVar8);
        prologCallback.pUserData = *(void **)(uVar1 + lVar8);
        std::
        vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ::push_back(&apiCallbackData.prologCallbacks,&prologCallback);
        epilogCallback.pUserData = *(void **)(puVar6[1] + lVar8);
        epilogCallback.current_api_callback = p_Var7;
        std::
        vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ::push_back(&apiCallbackData.epilogCallbacks,&epilogCallback);
        lVar8 = lVar8 + 0xcb8;
      }
    }
    zeApiPtr = DAT_001893e8;
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              *)&local_60,&apiCallbackData.prologCallbacks);
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              *)&local_78,&apiCallbackData.epilogCallbacks);
    zVar3 = APITracerWrapperImp<_ze_result_t(*)(_ze_command_list_handle_t*,void_const*,unsigned_long),_ze_command_list_append_memory_prefetch_params_t*,void(*)(_ze_command_list_append_memory_prefetch_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_memory_prefetch_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_memory_prefetch_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_memory_prefetch_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_memory_prefetch_params_t*,_ze_result_t,void*,void**)>>>,_ze_command_list_handle_t*&,void_const*&,unsigned_long&>
                      (zeApiPtr,&tracerParams,p_Var7,
                       (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        *)&local_60,
                       (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        *)&local_78,&hCommandList_local,&ptr_local,&size_local);
    std::
    _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::~_Vector_base(&local_78);
    std::
    _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::~_Vector_base(&local_60);
    APITracerCallbackDataImp<void_(*)(_ze_command_list_append_memory_prefetch_params_t_*,__ze_result_t,_void_*,_void_**)>
    ::~APITracerCallbackDataImp(&apiCallbackData);
  }
  return zVar3;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendMemoryPrefetch(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of command list
        const void* ptr,                                ///< [in] pointer to start of the memory range to prefetch
        size_t size                                     ///< [in] size in bytes of the memory range to prefetch
        )
    {
        auto pfnAppendMemoryPrefetch = context.zeDdiTable.CommandList.pfnAppendMemoryPrefetch;

        if( nullptr == pfnAppendMemoryPrefetch)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.CommandList.pfnAppendMemoryPrefetch, hCommandList, ptr, size);

        // capture parameters
        ze_command_list_append_memory_prefetch_params_t tracerParams = {
            &hCommandList,
            &ptr,
            &size
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnCommandListAppendMemoryPrefetchCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnCommandListAppendMemoryPrefetchCb_t, CommandList, pfnAppendMemoryPrefetchCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.CommandList.pfnAppendMemoryPrefetch,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phCommandList,
                                                  *tracerParams.pptr,
                                                  *tracerParams.psize);
    }